

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_object_list_add(JSContext *ctx,JSObjectList *s,JSObject *obj)

{
  long lVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  undefined8 *puVar5;
  JSObject *in_RDX;
  JSContext *in_RSI;
  uint32_t new_hash_size;
  uint32_t h;
  JSObjectListEntry *e;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  int local_4;
  
  uVar4 = (uint32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  iVar2 = js_resize_array(in_RSI,(void **)in_RDX,uVar4,
                          (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
  if (iVar2 == 0) {
    if (*(uint *)&in_RSI->rt <= *(int *)&(in_RSI->header).link.prev + 1U) {
      for (uVar3 = max_uint32(*(uint32_t *)&in_RSI->rt,4);
          uVar3 <= *(uint *)&(in_RSI->header).link.prev; uVar3 = uVar3 << 1) {
      }
      iVar2 = js_object_list_resize_hash(in_RSI,(JSObjectList *)in_RDX,uVar4);
      if (iVar2 != 0) {
        return -1;
      }
    }
    lVar1 = *(long *)&in_RSI->header;
    iVar2 = *(int *)&(in_RSI->header).link.prev;
    *(int *)&(in_RSI->header).link.prev = iVar2 + 1;
    puVar5 = (undefined8 *)(lVar1 + (long)iVar2 * 0x10);
    uVar4 = js_object_list_get_hash(in_RDX,*(uint32_t *)&in_RSI->rt);
    *puVar5 = in_RDX;
    *(undefined4 *)(puVar5 + 1) =
         *(undefined4 *)((long)&((in_RSI->header).link.next)->prev + (ulong)uVar4 * 4);
    *(int *)((long)&((in_RSI->header).link.next)->prev + (ulong)uVar4 * 4) =
         *(int *)&(in_RSI->header).link.prev + -1;
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int js_object_list_add(JSContext *ctx, JSObjectList *s, JSObject *obj)
{
    JSObjectListEntry *e;
    uint32_t h, new_hash_size;
    
    if (js_resize_array(ctx, (void *)&s->object_tab,
                        sizeof(s->object_tab[0]),
                        &s->object_size, s->object_count + 1))
        return -1;
    if (unlikely((s->object_count + 1) >= s->hash_size)) {
        new_hash_size = max_uint32(s->hash_size, 4);
        while (new_hash_size <= s->object_count)
            new_hash_size *= 2;
        if (js_object_list_resize_hash(ctx, s, new_hash_size))
            return -1;
    }
    e = &s->object_tab[s->object_count++];
    h = js_object_list_get_hash(obj, s->hash_size); 
    e->obj = obj;
    e->hash_next = s->hash_table[h];
    s->hash_table[h] = s->object_count - 1;
    return 0;
}